

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ChatLogging.cpp
# Opt level: O1

void __thiscall RenX_ChatLogPlugin::~RenX_ChatLogPlugin(RenX_ChatLogPlugin *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char cVar3;
  
  *(undefined ***)this = &PTR_think_00109848;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_00109d28;
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::fstream::close();
  }
  std::fstream::~fstream(&this->fs);
  pcVar2 = (this->last_date)._M_dataplus._M_p;
  paVar1 = &(this->last_date).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  RenX::Plugin::~Plugin(&this->super_Plugin);
  return;
}

Assistant:

RenX_ChatLogPlugin::~RenX_ChatLogPlugin()
{
	if (fs.is_open()) {
		fs.close();
	}
}